

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_spy_ImportEnumerator.cpp
# Opt level: O0

bool axl::spy::enumerateImports(ImportIterator *iterator,void *module)

{
  size_t sVar1;
  Elf64_Sym *pEVar2;
  char *pcVar3;
  ElfImportEnumeration *pEVar4;
  ImportIterator *this;
  ElfImportEnumeration *pEVar5;
  ImportIterator *pIVar6;
  size_t *in_RSI;
  Ptr<axl::spy::ElfImportEnumeration> enumeration;
  size_t gotRelCount;
  size_t pltRelCount;
  Elf64_Dyn *dyn;
  Elf64_Dyn *dynTable [35];
  link_map *linkMap;
  ImportIterator *in_stack_fffffffffffffce8;
  ImportIterator *in_stack_fffffffffffffcf0;
  ImportIterator *this_00;
  ImportIterator *in_stack_fffffffffffffd00;
  ElfRel *local_2f0;
  char *in_stack_fffffffffffffd18;
  ErrorRef *in_stack_fffffffffffffd20;
  ElfRel *local_2c8;
  ImportIterator *local_268;
  ElfImportEnumeration *local_260;
  size_t *local_250;
  Ptr<axl::spy::ElfImportEnumeration> local_1e8 [7];
  ImportIterator *local_178;
  ElfImportEnumeration *local_170;
  ulong *local_140;
  long local_138 [5];
  long local_110;
  long local_108;
  long local_100;
  long local_f8;
  long local_f0;
  long local_e8;
  long local_e0;
  long local_80;
  size_t *local_20;
  byte local_1;
  
  local_250 = in_RSI;
  if (in_RSI == (size_t *)0x0) {
    local_250 = _operator_delete;
  }
  local_20 = local_250;
  memset(local_138,0,0x118);
  for (local_140 = (ulong *)local_20[2]; *local_140 != 0; local_140 = local_140 + 2) {
    if (*local_140 < 0x23) {
      local_138[*local_140] = (long)local_140;
    }
  }
  if ((((((local_108 == 0) || (local_e0 == 0)) || (local_110 == 0)) ||
       ((local_e8 == 0 || ((local_100 == 0) != (local_f8 == 0))))) ||
      (((local_100 == 0) != (local_f0 == 0) ||
       (((local_80 == 0) != (local_138[2] == 0) || (*(long *)(local_e0 + 8) != 0x18)))))) ||
     ((local_f0 != 0 && (*(long *)(local_f0 + 8) != 0x18)))) {
    err::ErrorRef::ErrorRef(in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
    err::setError((ErrorRef *)0x152c24);
    err::ErrorRef::~ErrorRef((ErrorRef *)0x152c33);
    local_1 = 0;
  }
  else {
    if (local_138[2] == 0) {
      local_260 = (ElfImportEnumeration *)0x0;
    }
    else {
      local_260 = (ElfImportEnumeration *)(*(ulong *)(local_138[2] + 8) / 0x18);
    }
    local_170 = local_260;
    if (local_f8 == 0) {
      local_268 = (ImportIterator *)0x0;
    }
    else {
      local_268 = (ImportIterator *)(*(ulong *)(local_f8 + 8) / 0x18);
    }
    local_178 = local_268;
    if ((local_260 == (ElfImportEnumeration *)0x0) && (local_268 == (ImportIterator *)0x0)) {
      ImportIterator::ImportIterator(in_stack_fffffffffffffd00);
      ImportIterator::operator=(in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
      ImportIterator::~ImportIterator(in_stack_fffffffffffffcf0);
      local_1 = 1;
    }
    else {
      mem::allocate(0x152d80);
      ElfImportEnumeration::ElfImportEnumeration((ElfImportEnumeration *)in_stack_fffffffffffffcf0);
      rc::primeRefCount<axl::spy::ElfImportEnumeration>
                ((ElfImportEnumeration *)in_stack_fffffffffffffcf0,
                 (FreeFunc *)in_stack_fffffffffffffce8);
      rc::Ptr<axl::spy::ElfImportEnumeration>::Ptr<axl::spy::ElfImportEnumeration>
                ((Ptr<axl::spy::ElfImportEnumeration> *)in_stack_fffffffffffffcf0,
                 (ElfImportEnumeration *)in_stack_fffffffffffffce8);
      sVar1 = *local_20;
      pEVar4 = rc::Ptr<axl::spy::ElfImportEnumeration>::operator->(local_1e8);
      pEVar4->m_baseAddress = sVar1;
      pEVar2 = *(Elf64_Sym **)(local_108 + 8);
      pEVar4 = rc::Ptr<axl::spy::ElfImportEnumeration>::operator->(local_1e8);
      pEVar4->m_symbolTable = pEVar2;
      pcVar3 = *(char **)(local_110 + 8);
      pEVar4 = rc::Ptr<axl::spy::ElfImportEnumeration>::operator->(local_1e8);
      pEVar4->m_stringTable = pcVar3;
      sVar1 = *(size_t *)(local_e8 + 8);
      pEVar4 = rc::Ptr<axl::spy::ElfImportEnumeration>::operator->(local_1e8);
      pEVar4->m_stringTableSize = sVar1;
      if (local_80 == 0) {
        local_2c8 = (ElfRel *)0x0;
      }
      else {
        local_2c8 = *(ElfRel **)(local_80 + 8);
      }
      pEVar4 = rc::Ptr<axl::spy::ElfImportEnumeration>::operator->(local_1e8);
      pEVar4->m_pltRelTable = local_2c8;
      pEVar4 = local_170;
      this = (ImportIterator *)rc::Ptr<axl::spy::ElfImportEnumeration>::operator->(local_1e8);
      (this->super_ImportIteratorBase).m_slot = (void **)pEVar4;
      if (local_100 == 0) {
        local_2f0 = (ElfRel *)0x0;
      }
      else {
        local_2f0 = *(ElfRel **)(local_100 + 8);
      }
      pEVar5 = rc::Ptr<axl::spy::ElfImportEnumeration>::operator->(local_1e8);
      pEVar5->m_gotRelTable = local_2f0;
      this_00 = local_178;
      pEVar5 = rc::Ptr<axl::spy::ElfImportEnumeration>::operator->(local_1e8);
      pEVar5->m_gotRelCount = (size_t)this_00;
      pIVar6 = (ImportIterator *)rc::Ptr::operator_cast_to_ElfImportEnumeration_((Ptr *)local_1e8);
      ImportIterator::ImportIterator(this,pEVar4);
      ImportIterator::operator=(this_00,pIVar6);
      ImportIterator::~ImportIterator(this_00);
      local_1 = 1;
      rc::Ptr<axl::spy::ElfImportEnumeration>::~Ptr((Ptr<axl::spy::ElfImportEnumeration> *)0x152ffc)
      ;
    }
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool
enumerateImports(
	ImportIterator* iterator,
	void* module
) {
	link_map* linkMap = module ? (link_map*)module : _r_debug.r_map;

	ElfW(Dyn)* dynTable[DT_NUM] = { 0 };
	ElfW(Dyn)* dyn = linkMap->l_ld;
	for (; dyn->d_tag; dyn++)
		if (dyn->d_tag < countof(dynTable))
			dynTable[dyn->d_tag] = dyn;

	// sanity check

	if (!dynTable[DT_SYMTAB] ||
		!dynTable[DT_SYMENT] ||
		!dynTable[DT_STRTAB] ||
		!dynTable[DT_STRSZ] ||
		!dynTable[DT_GOT_REL] != !dynTable[DT_GOT_RELSZ] ||
		!dynTable[DT_GOT_REL] != !dynTable[DT_GOT_RELENT] ||
		!dynTable[DT_JMPREL] != !dynTable[DT_PLTRELSZ] ||
		dynTable[DT_SYMENT]->d_un.d_val != sizeof(ElfW(Sym)) ||
		dynTable[DT_GOT_RELENT] && dynTable[DT_GOT_RELENT]->d_un.d_val != sizeof(ElfRel)) {
		err::setError("invalid ELF (missing or bad section(s))");
		return false;
	}

	size_t pltRelCount = dynTable[DT_PLTRELSZ] ? dynTable[DT_PLTRELSZ]->d_un.d_val / sizeof(ElfRel) : 0;
	size_t gotRelCount = dynTable[DT_GOT_RELSZ] ? dynTable[DT_GOT_RELSZ]->d_un.d_val / sizeof(ElfRel) : 0;

	if (!pltRelCount && !gotRelCount) {
		*iterator = ImportIterator();
		return true;
	}

	rc::Ptr<ElfImportEnumeration> enumeration = AXL_RC_NEW(ElfImportEnumeration);
	enumeration->m_baseAddress = linkMap->l_addr;
	enumeration->m_symbolTable = (ElfW(Sym)*)dynTable[DT_SYMTAB]->d_un.d_ptr;
	enumeration->m_stringTable = (char*)dynTable[DT_STRTAB]->d_un.d_ptr;
	enumeration->m_stringTableSize = dynTable[DT_STRSZ]->d_un.d_val;
	enumeration->m_pltRelTable = dynTable[DT_JMPREL] ? (ElfRel*)dynTable[DT_JMPREL]->d_un.d_ptr : NULL;
	enumeration->m_pltRelCount = pltRelCount;
	enumeration->m_gotRelTable = dynTable[DT_GOT_REL] ? (ElfRel*)dynTable[DT_GOT_REL]->d_un.d_ptr : NULL;
	enumeration->m_gotRelCount = gotRelCount;

	*iterator = ImportIterator(enumeration);
	return true;
}